

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

bool __thiscall World::resetTet(World *this,TetrominoType *type)

{
  byte bVar1;
  int iVar2;
  Vec2d *pVVar3;
  TetrominoType *pTVar4;
  Tetromino *pTVar5;
  Vec2d *direction;
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar6;
  float fVar7;
  bool success;
  vector<Quad_*,_std::allocator<Quad_*>_> *resetQuads;
  Translation translation;
  int spawnOffset;
  int spawnOffset_1;
  TetrominoType *randomType;
  Vec2d *newCoords;
  TetrominoType *type_local;
  World *this_local;
  
  pVVar3 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(pVVar3,this->spawnPoint);
  if (this->nextTet == (Tetromino *)0x0) {
    pTVar4 = TetrominoTypeFactory::getRandomType(this->typeFactory);
    translation.direction._4_4_ = TetrominoType::getHeight(pTVar4);
    fVar7 = Vec2d::getY(pVVar3);
    Vec2d::setY(pVVar3,fVar7 - (float)translation.direction._4_4_);
    pTVar5 = TetrominoFactory::getTetromino(this->tetFactory,pTVar4,pVVar3);
    pTVar5 = Tetromino::withDirection(pTVar5,this->defaultDirection);
    this->activeTet = pTVar5;
  }
  else {
    if (this->activeTet != (Tetromino *)0x0) {
      (**(code **)(*(long *)&this->activeTet->super_Entity + 8))();
    }
    this->activeTet = this->nextTet;
  }
  pTVar4 = TetrominoTypeFactory::getRandomType(this->typeFactory);
  translation.direction._0_4_ = TetrominoType::getHeight(pTVar4);
  if (pVVar3 != (Vec2d *)0x0) {
    operator_delete(pVVar3);
  }
  pVVar3 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(pVVar3,this->spawnPoint);
  if (this->mode == INFINITY_MODE) {
    iVar2 = rand();
    Vec2d::setX(pVVar3,(float)(iVar2 % 8 + 1));
  }
  fVar7 = Vec2d::getY(pVVar3);
  Vec2d::setY(pVVar3,fVar7 - (float)(int)translation.direction);
  pTVar5 = TetrominoFactory::getTetromino(this->tetFactory,pTVar4,pVVar3);
  pTVar5 = Tetromino::withDirection(pTVar5,this->defaultDirection);
  this->nextTet = pTVar5;
  direction = (Vec2d *)(**(code **)(*(long *)&this->activeTet->super_Entity + 0x10))();
  Translation::Translation((Translation *)&resetQuads,direction);
  pvVar6 = (vector<Quad_*,_std::allocator<Quad_*>_> *)
           (**(code **)(*(long *)&this->activeTet->super_Entity + 0x48))();
  pvVar6 = Translation::transform((Translation *)&resetQuads,pvVar6);
  bVar1 = (**(code **)(*(long *)&this->heap->super_Entity + 0x50))(this->heap,pvVar6);
  Quad::deleteQuads(pvVar6,true);
  if (pVVar3 != (Vec2d *)0x0) {
    operator_delete(pVVar3);
  }
  Translation::~Translation((Translation *)&resetQuads);
  return (bool)(~bVar1 & 1);
}

Assistant:

bool World::resetTet(TetrominoType* type) {
    Vec2d* newCoords = new Vec2d(spawnPoint);
    if (nextTet == nullptr) {
        TetrominoType* randomType = typeFactory->getRandomType();
        int spawnOffset = randomType->getHeight();
        newCoords->setY(newCoords->getY() - spawnOffset);
        activeTet = tetFactory->getTetromino(randomType, newCoords)->withDirection(defaultDirection);
    } else {
        delete activeTet;
        activeTet = nextTet;
    }

    type = typeFactory->getRandomType();
    int spawnOffset = type->getHeight();
    delete newCoords;

    newCoords = new Vec2d(spawnPoint);
    if (mode == INFINITY_MODE) newCoords->setX((rand() % 8) + 1);
    newCoords->setY(newCoords->getY() - spawnOffset);
    nextTet = tetFactory->getTetromino(type, newCoords)->withDirection(defaultDirection);
    
    Translation translation = Translation(activeTet->getCoords());
    
    vector<Quad*>* resetQuads = translation.transform(activeTet->getQuads());
    bool success = !heap->collidesWithQuads(resetQuads);
    
    Quad::deleteQuads(resetQuads, true);

    delete newCoords;
    
    return success;
}